

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.h
# Opt level: O0

bool spvtools::opt::analysis::operator==(TargetData *lhs,TargetData *rhs)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  TargetData *rhs_local;
  TargetData *lhs_local;
  
  cVar2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          begin(&lhs->direct_decorations);
  cVar3 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          end(&lhs->direct_decorations);
  cVar4 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          begin(&rhs->direct_decorations);
  bVar1 = std::
          is_permutation<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>>
                    ((__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                      )cVar2._M_current,
                     (__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                      )cVar3._M_current,
                     (__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                      )cVar4._M_current);
  if (bVar1) {
    cVar2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::begin(&lhs->indirect_decorations);
    cVar3 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::end(&lhs->indirect_decorations);
    cVar4 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::begin(&rhs->indirect_decorations);
    bVar1 = std::
            is_permutation<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>>
                      ((__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                        )cVar2._M_current,
                       (__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                        )cVar3._M_current,
                       (__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                        )cVar4._M_current);
    if (bVar1) {
      cVar2 = std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              begin(&lhs->decorate_insts);
      cVar3 = std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              end(&lhs->decorate_insts);
      cVar4 = std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              begin(&rhs->decorate_insts);
      bVar1 = std::
              is_permutation<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>>
                        ((__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                          )cVar2._M_current,
                         (__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                          )cVar3._M_current,
                         (__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                          )cVar4._M_current);
      if (bVar1) {
        lhs_local._7_1_ = true;
      }
      else {
        lhs_local._7_1_ = false;
      }
    }
    else {
      lhs_local._7_1_ = false;
    }
  }
  else {
    lhs_local._7_1_ = false;
  }
  return lhs_local._7_1_;
}

Assistant:

bool operator==(const TargetData& lhs, const TargetData& rhs) {
    if (!std::is_permutation(lhs.direct_decorations.begin(),
                             lhs.direct_decorations.end(),
                             rhs.direct_decorations.begin())) {
      return false;
    }
    if (!std::is_permutation(lhs.indirect_decorations.begin(),
                             lhs.indirect_decorations.end(),
                             rhs.indirect_decorations.begin())) {
      return false;
    }
    if (!std::is_permutation(lhs.decorate_insts.begin(),
                             lhs.decorate_insts.end(),
                             rhs.decorate_insts.begin())) {
      return false;
    }
    return true;
  }